

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

void __thiscall
Logger::log<std::pair<unsigned_short,void_const*>>
          (Logger *this,char *id,uint64_t pTime,uint64_t pThread,
          pair<unsigned_short,_const_void_*> *ts)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  ulong __n;
  pair<unsigned_short,_const_void_*> t;
  logful_context_t ctx;
  uint8_t logbuff [8192];
  
  if (this->mLogful == true) {
    ctx.tokenFormat._M_dataplus._M_p = (pointer)&ctx.tokenFormat.field_2;
    ctx.tokenFormat._M_string_length = 0;
    ctx.tokenFormat.field_2._M_local_buf[0] = '\0';
    iVar1 = sprintf((char *)logbuff,"%lluus %llut ",pTime,pThread);
    lVar3 = (long)iVar1;
    t._4_4_ = 0;
    t.first = ts->first;
    t._2_2_ = *(undefined2 *)&ts->field_0x2;
    t.second = ts->second;
    sVar2 = logful<std::pair<unsigned_short,void_const*>>(this,&ctx,logbuff + lVar3,id,t);
    logbuff[sVar2 + lVar3] = '\n';
    write(1,logbuff,sVar2 + lVar3 + 1);
    std::__cxx11::string::~string((string *)&ctx);
  }
  logbuff._0_8_ = (long)id - (long)LoggerRef;
  logbuff._27_2_ = ts->first;
  __n = (ulong)(ushort)logbuff._27_2_;
  logbuff[8] = 0xa7;
  logbuff[0x11] = 0xa7;
  logbuff[0x1a] = 0xae;
  logbuff._9_8_ = pTime;
  logbuff._18_8_ = pThread;
  memcpy(logbuff + 0x1d,ts->second,__n);
  logbuff[__n + 0x1d] = '\0';
  fwrite(logbuff,1,__n + 0x1e,(FILE *)this->mOutputFile);
  return;
}

Assistant:

void log(const char * id, uint64_t pTime, uint64_t pThread, const Ts&... ts)
    {
        if (mLogful)
        {
            logful_context_t ctx;
            uint8_t logbuff[4096*2];
            int flen = std::sprintf((char*)logbuff, "%lluus %llut ", (unsigned long long)pTime, (unsigned long long)pThread);
            size_t sz = flen + 
            logful(ctx, logbuff + flen, id, ts...);
            logbuff[sz++] = '\n';
            [[maybe_unused]] auto rv = ::write(1, logbuff, sz);
        }
        {
            uint8_t buffer[2048];
            uint8_t* usedBuffer = buffer;
            new (usedBuffer) HeaderType(intptr_t(id)-intptr_t(LoggerRef));
            usedBuffer += sizeof(HeaderType);
            size_t sz = logless(usedBuffer, pTime, pThread, ts...) + sizeof(HeaderType);
            std::fwrite((char*)buffer, 1, sz, mOutputFile);
        }
    }